

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

void * duckdb_miniz::tdefl_compress_mem_to_heap
                 (void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  mz_bool mVar1;
  tdefl_output_buffer out_buf;
  size_t local_28 [2];
  void *local_18;
  undefined8 uStack_10;
  
  local_18 = (void *)0x0;
  local_28[0] = 0;
  local_28[1] = 0;
  if (pOut_len != (size_t *)0x0) {
    *pOut_len = 0;
    uStack_10 = 1;
    mVar1 = tdefl_compress_mem_to_output
                      (pSrc_buf,src_buf_len,tdefl_output_buffer_putter,local_28,flags);
    if (mVar1 != 0) {
      *pOut_len = local_28[0];
      return local_18;
    }
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_compress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len, int flags)
{
    tdefl_output_buffer out_buf;
    MZ_CLEAR_OBJ(out_buf);
    if (!pOut_len)
        return MZ_FALSE;
    else
        *pOut_len = 0;
    out_buf.m_expandable = MZ_TRUE;
    if (!tdefl_compress_mem_to_output(pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags))
        return NULL;
    *pOut_len = out_buf.m_size;
    return out_buf.m_pBuf;
}